

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O0

void Gia_ManAddClausesMux(Swp_Man_t *p,Gia_Obj_t *pNode)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int RetValue;
  int LitE;
  int LitT;
  int LitI;
  int LitF;
  int pLits [4];
  Gia_Obj_t *local_30;
  Gia_Obj_t *pNodeE;
  Gia_Obj_t *pNodeT;
  Gia_Obj_t *pNodeI;
  Gia_Obj_t *pNode_local;
  Swp_Man_t *p_local;
  
  pNodeI = pNode;
  pNode_local = (Gia_Obj_t *)p;
  iVar2 = Gia_IsComplement(pNode);
  if (iVar2 != 0) {
    __assert_fail("!Gia_IsComplement( pNode )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                  ,0x223,"void Gia_ManAddClausesMux(Swp_Man_t *, Gia_Obj_t *)");
  }
  iVar2 = Gia_ObjIsMuxType(pNodeI);
  if (iVar2 == 0) {
    __assert_fail("Gia_ObjIsMuxType( pNode )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                  ,0x224,"void Gia_ManAddClausesMux(Swp_Man_t *, Gia_Obj_t *)");
  }
  pNodeT = Gia_ObjRecognizeMux(pNodeI,&pNodeE,&local_30);
  pGVar1 = pNode_local;
  iVar2 = Gia_Obj2Lit(*(Gia_Man_t **)pNode_local,pNodeI);
  iVar2 = Swp_ManLit2Lit((Swp_Man_t *)pGVar1,iVar2);
  pGVar1 = pNode_local;
  iVar3 = Gia_Obj2Lit(*(Gia_Man_t **)pNode_local,pNodeT);
  iVar3 = Swp_ManLit2Lit((Swp_Man_t *)pGVar1,iVar3);
  pGVar1 = pNode_local;
  iVar4 = Gia_Obj2Lit(*(Gia_Man_t **)pNode_local,pNodeE);
  iVar4 = Swp_ManLit2Lit((Swp_Man_t *)pGVar1,iVar4);
  pGVar1 = pNode_local;
  iVar5 = Gia_Obj2Lit(*(Gia_Man_t **)pNode_local,local_30);
  iVar5 = Swp_ManLit2Lit((Swp_Man_t *)pGVar1,iVar5);
  LitI = Abc_LitNotCond(iVar3,1);
  LitF = Abc_LitNotCond(iVar4,1);
  pLits[0] = Abc_LitNotCond(iVar2,0);
  iVar6 = sat_solver_addclause(*(sat_solver **)&pNode_local[3].field_0x4,&LitI,pLits + 1);
  if (iVar6 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                  ,0x239,"void Gia_ManAddClausesMux(Swp_Man_t *, Gia_Obj_t *)");
  }
  LitI = Abc_LitNotCond(iVar3,1);
  LitF = Abc_LitNotCond(iVar4,0);
  pLits[0] = Abc_LitNotCond(iVar2,1);
  iVar6 = sat_solver_addclause(*(sat_solver **)&pNode_local[3].field_0x4,&LitI,pLits + 1);
  if (iVar6 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                  ,0x23e,"void Gia_ManAddClausesMux(Swp_Man_t *, Gia_Obj_t *)");
  }
  LitI = Abc_LitNotCond(iVar3,0);
  LitF = Abc_LitNotCond(iVar5,1);
  pLits[0] = Abc_LitNotCond(iVar2,0);
  iVar6 = sat_solver_addclause(*(sat_solver **)&pNode_local[3].field_0x4,&LitI,pLits + 1);
  if (iVar6 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                  ,0x243,"void Gia_ManAddClausesMux(Swp_Man_t *, Gia_Obj_t *)");
  }
  LitI = Abc_LitNotCond(iVar3,0);
  LitF = Abc_LitNotCond(iVar5,0);
  pLits[0] = Abc_LitNotCond(iVar2,1);
  iVar3 = sat_solver_addclause(*(sat_solver **)&pNode_local[3].field_0x4,&LitI,pLits + 1);
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                  ,0x248,"void Gia_ManAddClausesMux(Swp_Man_t *, Gia_Obj_t *)");
  }
  if (iVar4 != iVar5) {
    LitI = Abc_LitNotCond(iVar4,0);
    LitF = Abc_LitNotCond(iVar5,0);
    pLits[0] = Abc_LitNotCond(iVar2,1);
    iVar3 = sat_solver_addclause(*(sat_solver **)&pNode_local[3].field_0x4,&LitI,pLits + 1);
    if (iVar3 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                    ,0x25b,"void Gia_ManAddClausesMux(Swp_Man_t *, Gia_Obj_t *)");
    }
    LitI = Abc_LitNotCond(iVar4,1);
    LitF = Abc_LitNotCond(iVar5,1);
    pLits[0] = Abc_LitNotCond(iVar2,0);
    iVar2 = sat_solver_addclause(*(sat_solver **)&pNode_local[3].field_0x4,&LitI,pLits + 1);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                    ,0x260,"void Gia_ManAddClausesMux(Swp_Man_t *, Gia_Obj_t *)");
    }
  }
  return;
}

Assistant:

static void Gia_ManAddClausesMux( Ssc_Man_t * p, Gia_Obj_t * pNode )
{
    Gia_Obj_t * pNodeI, * pNodeT, * pNodeE;
    int pLits[4], LitF, LitI, LitT, LitE, RetValue;
    assert( !Gia_IsComplement( pNode ) );
    assert( Gia_ObjIsMuxType( pNode ) );
    // get nodes (I = if, T = then, E = else)
    pNodeI = Gia_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    // get the Litiable numbers
    LitF = Ssc_ObjSatLit( p, Gia_Obj2Lit(p->pFraig,pNode) );
    LitI = Ssc_ObjSatLit( p, Gia_Obj2Lit(p->pFraig,pNodeI) );
    LitT = Ssc_ObjSatLit( p, Gia_Obj2Lit(p->pFraig,pNodeT) );
    LitE = Ssc_ObjSatLit( p, Gia_Obj2Lit(p->pFraig,pNodeE) );

    // f = ITE(i, t, e)

    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'

    // create four clauses
    pLits[0] = Abc_LitNotCond(LitI, 1);
    pLits[1] = Abc_LitNotCond(LitT, 1);
    pLits[2] = Abc_LitNotCond(LitF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = Abc_LitNotCond(LitI, 1);
    pLits[1] = Abc_LitNotCond(LitT, 0);
    pLits[2] = Abc_LitNotCond(LitF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = Abc_LitNotCond(LitI, 0);
    pLits[1] = Abc_LitNotCond(LitE, 1);
    pLits[2] = Abc_LitNotCond(LitF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = Abc_LitNotCond(LitI, 0);
    pLits[1] = Abc_LitNotCond(LitE, 0);
    pLits[2] = Abc_LitNotCond(LitF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );

    // two additional clauses
    // t' & e' -> f'
    // t  & e  -> f

    // t  + e   + f'
    // t' + e'  + f

    if ( LitT == LitE )
    {
//        assert( fCompT == !fCompE );
        return;
    }

    pLits[0] = Abc_LitNotCond(LitT, 0);
    pLits[1] = Abc_LitNotCond(LitE, 0);
    pLits[2] = Abc_LitNotCond(LitF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = Abc_LitNotCond(LitT, 1);
    pLits[1] = Abc_LitNotCond(LitE, 1);
    pLits[2] = Abc_LitNotCond(LitF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
}